

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O2

bool __thiscall QSqlError::operator!=(QSqlError *this,QSqlError *other)

{
  QSqlErrorPrivate *pQVar1;
  QSqlErrorPrivate *pQVar2;
  bool bVar3;
  
  pQVar1 = (this->d).d.ptr;
  pQVar2 = (other->d).d.ptr;
  if (pQVar1->errorType == pQVar2->errorType) {
    bVar3 = ::operator!=(&pQVar1->errorCode,&pQVar2->errorCode);
    return bVar3;
  }
  return true;
}

Assistant:

constexpr P get() const noexcept { return ptr; }